

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

size_t get_filesize(string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this;
  size_t sVar3;
  fpos local_238 [32];
  long local_218;
  ifstream ifs;
  string *filename_local;
  
  _Var2 = std::operator|(_S_ate,_S_bin);
  std::ifstream::ifstream(&local_218,(string *)filename,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_238._0_16_ = std::istream::tellg();
    sVar3 = std::fpos::operator_cast_to_long(local_238);
    std::ifstream::~ifstream(&local_218);
    return sVar3;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Failed open file ");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::size_t get_filesize(const std::string &filename)
{
    std::ifstream ifs(filename, std::ifstream::ate | std::ifstream::binary);
    if (!ifs)
        throw std::runtime_error("Failed open file ");

    return static_cast<std::size_t>(ifs.tellg());
}